

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O0

void __thiscall HighsMipSolver::callbackGetCutPool(HighsMipSolver *this)

{
  long lVar1;
  HighsInt HVar2;
  int *piVar3;
  double *pdVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  HighsSparseMatrix cut_matrix;
  vector<double,_std::allocator<double>_> cut_upper;
  vector<double,_std::allocator<double>_> cut_lower;
  HighsCallbackDataOut *data_out;
  HighsSparseMatrix *in_stack_00000378;
  vector<double,_std::allocator<double>_> *in_stack_00000380;
  vector<double,_std::allocator<double>_> *in_stack_00000388;
  HighsInt *in_stack_00000390;
  HighsInt *in_stack_00000398;
  HighsLpRelaxation *in_stack_000003a0;
  HighsSparseMatrix *in_stack_fffffffffffffef8;
  void *__args_4;
  HighsSparseMatrix *this_00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff1c;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_ffffffffffffff20;
  HighsSparseMatrix *in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x617ef8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x617f05);
  HighsSparseMatrix::HighsSparseMatrix(in_stack_ffffffffffffff30);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x617f22);
  HighsLpRelaxation::getCutPool
            (in_stack_000003a0,in_stack_00000398,in_stack_00000390,in_stack_00000388,
             in_stack_00000380,in_stack_00000378);
  HVar2 = HighsSparseMatrix::numNz(in_stack_fffffffffffffef8);
  *(HighsInt *)(lVar1 + 0xb8) = HVar2;
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x617f84);
  *(int **)(lVar1 + 0xc0) = piVar3;
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x617fa0);
  *(int **)(lVar1 + 200) = piVar3;
  pdVar4 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x617fbc);
  *(double **)(lVar1 + 0xd0) = pdVar4;
  pdVar4 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x617fd8);
  *(double **)(lVar1 + 0xd8) = pdVar4;
  pdVar4 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x617ff7);
  *(double **)(lVar1 + 0xe0) = pdVar4;
  __args_4 = *(void **)in_RDI;
  this_00 = (HighsSparseMatrix *)&stack0xffffffffffffff1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff20,"MIP cut pool",(allocator *)this_00);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator()(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_RDI,
               (HighsCallbackDataOut *)CONCAT44(HVar2,in_stack_ffffffffffffff08),
               (anon_struct_16_2_bb6a87e9 *)this_00,__args_4);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  HighsSparseMatrix::~HighsSparseMatrix(this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  return;
}

Assistant:

void HighsMipSolver::callbackGetCutPool() const {
  assert(callback_->user_callback);
  assert(callback_->callbackActive(kCallbackMipGetCutPool));
  HighsCallbackDataOut& data_out = callback_->data_out;

  std::vector<double> cut_lower;
  std::vector<double> cut_upper;
  HighsSparseMatrix cut_matrix;

  mipdata_->lp.getCutPool(data_out.cutpool_num_col, data_out.cutpool_num_cut,
                          cut_lower, cut_upper, cut_matrix);

  data_out.cutpool_num_nz = cut_matrix.numNz();
  data_out.cutpool_start = cut_matrix.start_.data();
  data_out.cutpool_index = cut_matrix.index_.data();
  data_out.cutpool_value = cut_matrix.value_.data();
  data_out.cutpool_lower = cut_lower.data();
  data_out.cutpool_upper = cut_upper.data();
  callback_->user_callback(kCallbackMipGetCutPool, "MIP cut pool",
                           &callback_->data_out, &callback_->data_in,
                           callback_->user_callback_data);
}